

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void nni_stat_set_string(nni_stat_item *item,char *s)

{
  nni_stat_info *pnVar1;
  char *__s2;
  int iVar2;
  char *pcVar3;
  
  pnVar1 = item->si_info;
  __s2 = (item->si_u).sv_string;
  nni_mtx_lock(&stats_val_lock);
  if (__s2 != (char *)0x0 && s != (char *)0x0) {
    iVar2 = strcmp(s,__s2);
    if (iVar2 == 0) goto LAB_00117103;
  }
  if ((pnVar1->field_0x18 & 2) != 0) {
    pcVar3 = nni_strdup(s);
    (item->si_u).sv_string = pcVar3;
    nni_mtx_unlock(&stats_val_lock);
    nni_strfree(__s2);
    return;
  }
  (item->si_u).sv_string = s;
LAB_00117103:
  nni_mtx_unlock(&stats_val_lock);
  return;
}

Assistant:

void
nni_stat_set_string(nni_stat_item *item, const char *s)
{
#ifdef NNG_ENABLE_STATS
	const nni_stat_info *info = item->si_info;
	char                *old  = item->si_u.sv_string;

	nni_mtx_lock(&stats_val_lock);
	if ((s != NULL) && (old != NULL) && (strcmp(s, old) == 0)) {
		// no change
		nni_mtx_unlock(&stats_val_lock);
		return;
	}

	if (!info->si_alloc) {
		// no allocation, just set it.
		item->si_u.sv_string = (char *) s;
		nni_mtx_unlock(&stats_val_lock);
		return;
	}

	item->si_u.sv_string = nni_strdup(s);
	nni_mtx_unlock(&stats_val_lock);

	nni_strfree(old);
#else
	NNI_ARG_UNUSED(item);
	NNI_ARG_UNUSED(s);
#endif
}